

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  int iVar1;
  int iVar2;
  int local_30;
  uint initialSize;
  int result;
  int upper;
  int lower;
  Cudd_ReorderingType method_local;
  MtrNode *treenode_local;
  DdManager *table_local;
  
  initialSize = 0xffffffff;
  upper = method;
  _lower = treenode;
  treenode_local = (MtrNode *)table;
  ddFindNodeHiLo(table,treenode,&result,(int *)&initialSize);
  if (initialSize == 0xffffffff) {
    table_local._4_4_ = 1;
  }
  else {
    if (_lower->flags == 4) {
      local_30 = 1;
    }
    else {
      switch(upper) {
      case 2:
      case 3:
        local_30 = cuddSwapping((DdManager *)treenode_local,result,initialSize,upper);
        break;
      case 4:
        local_30 = cuddSifting((DdManager *)treenode_local,result,initialSize);
        break;
      case 5:
        do {
          iVar1 = *(int *)((long)&treenode_local[4].elder + 4);
          iVar2 = *(int *)&treenode_local[6].parent;
          local_30 = cuddSifting((DdManager *)treenode_local,result,initialSize);
          if ((uint)(iVar1 - iVar2) <=
              (uint)(*(int *)((long)&treenode_local[4].elder + 4) -
                    *(int *)&treenode_local[6].parent)) break;
        } while (local_30 != 0);
        break;
      case 6:
        local_30 = cuddSymmSifting((DdManager *)treenode_local,result,initialSize);
        break;
      case 7:
        local_30 = cuddSymmSiftingConv((DdManager *)treenode_local,result,initialSize);
        break;
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
        local_30 = cuddWindowReorder((DdManager *)treenode_local,result,initialSize,upper);
        break;
      case 0xe:
        if (treenode_local[0xb].size == 0) {
          local_30 = ddGroupSifting((DdManager *)treenode_local,result,initialSize,ddNoCheck,0);
        }
        else if (treenode_local[0xb].size == 5) {
          local_30 = ddGroupSifting((DdManager *)treenode_local,result,initialSize,ddExtSymmCheck,0)
          ;
        }
        else if (treenode_local[0xb].size == 7) {
          local_30 = ddGroupSifting((DdManager *)treenode_local,result,initialSize,ddExtSymmCheck,0)
          ;
        }
        else {
          fprintf((FILE *)treenode_local[0xc].younger,"Unknown group ckecking method\n");
          local_30 = 0;
        }
        break;
      case 0xf:
        do {
          iVar1 = *(int *)((long)&treenode_local[4].elder + 4);
          iVar2 = *(int *)&treenode_local[6].parent;
          if (treenode_local[0xb].size == 0) {
            ddGroupSifting((DdManager *)treenode_local,result,initialSize,ddNoCheck,0);
          }
          else if (treenode_local[0xb].size == 5) {
            ddGroupSifting((DdManager *)treenode_local,result,initialSize,ddExtSymmCheck,0);
          }
          else if (treenode_local[0xb].size == 7) {
            ddGroupSifting((DdManager *)treenode_local,result,initialSize,ddExtSymmCheck,0);
          }
          else {
            fprintf((FILE *)treenode_local[0xc].younger,"Unknown group ckecking method\n");
          }
          local_30 = cuddWindowReorder((DdManager *)treenode_local,result,initialSize,
                                       CUDD_REORDER_WINDOW4);
        } while (((uint)(*(int *)((long)&treenode_local[4].elder + 4) -
                        *(int *)&treenode_local[6].parent) < (uint)(iVar1 - iVar2)) &&
                (local_30 != 0));
        break;
      case 0x10:
        local_30 = cuddAnnealing((DdManager *)treenode_local,result,initialSize);
        break;
      case 0x11:
        local_30 = cuddGa((DdManager *)treenode_local,result,initialSize);
        break;
      case 0x12:
        local_30 = cuddLinearAndSifting((DdManager *)treenode_local,result,initialSize);
        break;
      case 0x13:
        do {
          iVar1 = *(int *)((long)&treenode_local[4].elder + 4);
          iVar2 = *(int *)&treenode_local[6].parent;
          local_30 = cuddLinearAndSifting((DdManager *)treenode_local,result,initialSize);
          if ((uint)(iVar1 - iVar2) <=
              (uint)(*(int *)((long)&treenode_local[4].elder + 4) -
                    *(int *)&treenode_local[6].parent)) break;
        } while (local_30 != 0);
        break;
      case 0x14:
        local_30 = ddGroupSifting((DdManager *)treenode_local,result,initialSize,ddVarGroupCheck,1);
        break;
      case 0x15:
        local_30 = cuddExact((DdManager *)treenode_local,result,initialSize);
        break;
      default:
        return 0;
      }
    }
    ddMergeGroups((DdManager *)treenode_local,_lower,result,initialSize);
    table_local._4_4_ = local_30;
  }
  return table_local._4_4_;
}

Assistant:

static int
ddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    ddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            if (table->groupcheck == CUDD_NO_CHECK) {
                result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else {
                (void) fprintf(table->err,
                               "Unknown group ckecking method\n");
                result = 0;
            }
            break;
        case CUDD_REORDER_GROUP_SIFT_CONV:
            do {
                initialSize = table->keys - table->isolated;
                if (table->groupcheck == CUDD_NO_CHECK) {
                    result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else {
                    (void) fprintf(table->err,
                                   "Unknown group ckecking method\n");
                    result = 0;
                }
#ifdef DD_STATS
                (void) fprintf(table->out,"\n");
#endif
                result = cuddWindowReorder(table,lower,upper,
                                           CUDD_REORDER_WINDOW4);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_WINDOW2:
        case CUDD_REORDER_WINDOW3:
        case CUDD_REORDER_WINDOW4:
        case CUDD_REORDER_WINDOW2_CONV:
        case CUDD_REORDER_WINDOW3_CONV:
        case CUDD_REORDER_WINDOW4_CONV:
            result = cuddWindowReorder(table,lower,upper,method);
            break;
        case CUDD_REORDER_ANNEALING:
            result = cuddAnnealing(table,lower,upper);
            break;
        case CUDD_REORDER_GENETIC:
            result = cuddGa(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddLinearAndSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddLinearAndSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_EXACT:
            result = cuddExact(table,lower,upper);
            break;
        case CUDD_REORDER_LAZY_SIFT:
            result = ddGroupSifting(table,lower,upper,ddVarGroupCheck,
                                    DD_LAZY_SIFT);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of ddGroupSifting.
    */
    ddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddReorderChildren:");
#endif

    return(result);

}